

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.h
# Opt level: O0

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::ReadObjectPropertiesIntoObject
          (DeserializationCloner<Js::StreamReader> *this,RecyclableObject *m_obj)

{
  ScriptContext *pSVar1;
  scaposition_t src;
  uint uVar2;
  Engine *this_00;
  void *local_40;
  Var value;
  PropertyRecord *propertyRecord;
  char16 *name;
  ScriptContext *pSStack_20;
  charcount_t len;
  ScriptContext *scriptContext;
  RecyclableObject *m_obj_local;
  DeserializationCloner<Js::StreamReader> *this_local;
  
  scriptContext = (ScriptContext *)m_obj;
  m_obj_local = (RecyclableObject *)this;
  pSStack_20 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
  while( true ) {
    name._4_4_ = 0;
    propertyRecord = (PropertyRecord *)TryReadString(this,(charcount_t *)((long)&name + 4),true);
    if (propertyRecord == (PropertyRecord *)0x0) {
      return;
    }
    ScriptContext::GetOrAddPropertyRecord
              (pSStack_20,(LPCWSTR)propertyRecord,name._4_4_,(PropertyRecord **)&value);
    this_00 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
              ::GetEngine(&this->
                           super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                         );
    src = StreamReader::GetPosition(this->m_reader);
    SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
              (this_00,src,&local_40);
    pSVar1 = scriptContext;
    if (local_40 == (void *)0x0) break;
    uVar2 = PropertyRecord::GetPropertyId((PropertyRecord *)value);
    (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x17])
              (pSVar1,(ulong)uVar2,local_40,0,0);
  }
  ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
}

Assistant:

void ReadObjectPropertiesIntoObject(RecyclableObject* m_obj)
        {
            ScriptContext* scriptContext = this->GetScriptContext();

            for(;;)
            {
                charcount_t len = 0;
                const char16* name = TryReadString(&len, /*reuseBuffer*/ true);
                if (!name)
                {
                    break;
                }

                Js::PropertyRecord const * propertyRecord;
                scriptContext->GetOrAddPropertyRecord(name, len, &propertyRecord);

                // NOTE: 'Clone' may reenter here and use the buffer that backs the 'name'.
                //       That is ok, since we do not need it past this point.
                //       The propertyRecord keeps its own copy od the data.

                Var value;
                this->GetEngine()->Clone(m_reader->GetPosition(), &value);
                if (!value)
                {
                    this->ThrowSCADataCorrupt();
                }

                m_obj->SetProperty(propertyRecord->GetPropertyId(), value, PropertyOperation_None, NULL); //Note: no prototype check
            }
        }